

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O3

WebPMuxError SetAlphaAndImageChunks(WebPData *bitstream,int copy_data,WebPMuxImage *wpi)

{
  WebPChunk *pWVar1;
  int iVar2;
  WebPMuxError WVar3;
  WebPMux *mux;
  long lVar4;
  bool bVar5;
  WebPData image;
  WebPData alpha;
  WebPData local_48;
  WebPData local_38;
  
  local_38.bytes = (uint8_t *)0x0;
  local_38.size = 0;
  if ((bitstream->size < 4) || (*(int *)bitstream->bytes != 0x46464952)) {
    local_48.bytes = bitstream->bytes;
    local_48.size = bitstream->size;
    bVar5 = true;
  }
  else {
    mux = WebPMuxCreateInternal(bitstream,0,0x108);
    if (mux == (WebPMux *)0x0) {
      return WEBP_MUX_BAD_DATA;
    }
    pWVar1 = mux->images_->img_;
    local_48.bytes = (pWVar1->data_).bytes;
    local_48.size = (pWVar1->data_).size;
    pWVar1 = mux->images_->alpha_;
    if (pWVar1 == (WebPChunk *)0x0) {
      bVar5 = true;
    }
    else {
      local_38.bytes = (pWVar1->data_).bytes;
      local_38.size = (pWVar1->data_).size;
      bVar5 = local_38.bytes == (uint8_t *)0x0;
    }
    WebPMuxDelete(mux);
  }
  iVar2 = VP8LCheckSignature(local_48.bytes,local_48.size);
  lVar4 = 0x48;
  if (iVar2 == 0) {
    lVar4 = 0x3c;
  }
  if ((!bVar5) &&
     (WVar3 = AddDataToChunkList(&local_38,copy_data,0x48504c41,&wpi->alpha_), WVar3 != WEBP_MUX_OK)
     ) {
    return WVar3;
  }
  WVar3 = AddDataToChunkList(&local_48,copy_data,*(uint32_t *)((long)&kChunks[0].tag + lVar4),
                             &wpi->img_);
  if (WVar3 == WEBP_MUX_OK) {
    iVar2 = MuxImageFinalize(wpi);
    WVar3 = -(uint)(iVar2 == 0) | WEBP_MUX_OK;
  }
  return WVar3;
}

Assistant:

static WebPMuxError SetAlphaAndImageChunks(
    const WebPData* const bitstream, int copy_data, WebPMuxImage* const wpi) {
  int is_lossless = 0;
  WebPData image, alpha;
  WebPMuxError err = GetImageData(bitstream, &image, &alpha, &is_lossless);
  const int image_tag =
      is_lossless ? kChunks[IDX_VP8L].tag : kChunks[IDX_VP8].tag;
  if (err != WEBP_MUX_OK) return err;
  if (alpha.bytes != NULL) {
    err = AddDataToChunkList(&alpha, copy_data, kChunks[IDX_ALPHA].tag,
                             &wpi->alpha_);
    if (err != WEBP_MUX_OK) return err;
  }
  err = AddDataToChunkList(&image, copy_data, image_tag, &wpi->img_);
  if (err != WEBP_MUX_OK) return err;
  return MuxImageFinalize(wpi) ? WEBP_MUX_OK : WEBP_MUX_INVALID_ARGUMENT;
}